

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-parse.c
# Opt level: O0

_Bool fy_tag_is_default(char *handle,size_t handle_size,char *prefix,size_t prefix_size)

{
  fy_tag *pfVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  fy_tag *fytag;
  size_t sStack_30;
  int i;
  size_t prefix_size_local;
  char *prefix_local;
  size_t handle_size_local;
  char *handle_local;
  
  prefix_local = (char *)handle_size;
  if (handle_size == 0xffffffffffffffff) {
    prefix_local = (char *)strlen(handle);
  }
  sStack_30 = prefix_size;
  if (prefix_size == 0xffffffffffffffff) {
    sStack_30 = strlen(prefix);
  }
  fytag._4_4_ = 0;
  while( true ) {
    pfVar1 = fy_default_tags[fytag._4_4_];
    if (pfVar1 == (fy_tag *)0x0) {
      return false;
    }
    pcVar3 = (char *)strlen(pfVar1->handle);
    if ((((prefix_local == pcVar3) &&
         (iVar2 = memcmp(handle,pfVar1->handle,(size_t)prefix_local), iVar2 == 0)) &&
        (sVar4 = strlen(pfVar1->prefix), sStack_30 == sVar4)) &&
       (iVar2 = memcmp(prefix,pfVar1->prefix,sStack_30), iVar2 == 0)) break;
    fytag._4_4_ = fytag._4_4_ + 1;
  }
  return true;
}

Assistant:

bool fy_tag_is_default(const char *handle, size_t handle_size,
                       const char *prefix, size_t prefix_size) {
    int i;
    const struct fy_tag *fytag;

    if (handle_size == (size_t) -1)
        handle_size = strlen(handle);

    if (prefix_size == (size_t) -1)
        prefix_size = strlen(prefix);

    for (i = 0; (fytag = fy_default_tags[i]) != NULL; i++) {

        if (handle_size == strlen(fytag->handle) &&
            !memcmp(handle, fytag->handle, handle_size) &&
            prefix_size == strlen(fytag->prefix) &&
            !memcmp(prefix, fytag->prefix, prefix_size))
            return true;

    }
    return false;
}